

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-tool.cc
# Opt level: O0

bool elf_process(map *map,sha *sha,string *infile)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  char *pcVar4;
  int *piVar5;
  reference s_00;
  long lVar6;
  section_t *s;
  iterator __end1;
  iterator __begin1;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *__range1;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> sections;
  uint found;
  int fd;
  undefined1 local_78 [8];
  Elf_parser elf_parser;
  string *infile_local;
  sha *sha_local;
  map *map_local;
  
  elf_parser._72_8_ = infile;
  poVar2 = std::operator<<((ostream *)&std::cout,"processing ");
  poVar2 = std::operator<<(poVar2,(string *)elf_parser._72_8_);
  std::operator<<(poVar2,"\n");
  ::elf_parser::Elf_parser::Elf_parser((Elf_parser *)local_78,(string *)elf_parser._72_8_);
  bVar1 = ::elf_parser::Elf_parser::failed((Elf_parser *)local_78);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)elf_parser._72_8_);
    poVar2 = std::operator<<(poVar2,": readelf failed: ");
    psVar3 = ::elf_parser::Elf_parser::last_error_abi_cxx11_((Elf_parser *)local_78);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,"\n");
    map_local._7_1_ = false;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    sections.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = open(pcVar4,2);
    if (sections.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)elf_parser._72_8_);
      poVar2 = std::operator<<(poVar2," open failed: ");
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::operator<<(poVar2,"\n");
      map_local._7_1_ = false;
    }
    else {
      sections.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      ::elf_parser::Elf_parser::get_sections
                ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)&__range1,
                 (Elf_parser *)local_78);
      __end1 = std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::begin
                         ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)
                          &__range1);
      s = (section_t *)
          std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::end
                    ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)
                     &__range1);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
                                    *)&s);
        if (!bVar1) break;
        s_00 = __gnu_cxx::
               __normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
               ::operator*(&__end1);
        lVar6 = std::__cxx11::string::find((char *)&s_00->section_name,0x1311e5);
        if (lVar6 != -1) {
          bVar1 = elf_process_section(map,sha,(string *)elf_parser._72_8_,
                                      sections.
                                      super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,s_00)
          ;
          if (!bVar1) {
            map_local._7_1_ = false;
            goto LAB_00109996;
          }
          sections.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)sections.
                    super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
        }
        __gnu_cxx::
        __normal_iterator<elf_parser::section_t_*,_std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>_>
        ::operator++(&__end1);
      }
      close(sections.
            super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if ((int)sections.
               super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"warn: ");
        poVar2 = std::operator<<(poVar2,(string *)elf_parser._72_8_);
        std::operator<<(poVar2," : does not contain .sshash.str sections\n");
      }
      map_local._7_1_ = true;
LAB_00109996:
      std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::~vector
                ((vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *)&__range1)
      ;
    }
  }
  ::elf_parser::Elf_parser::~Elf_parser((Elf_parser *)local_78);
  return map_local._7_1_;
}

Assistant:

static bool elf_process(sshash::map& map, sshash::sha& sha, const std::string& infile)
{
	std::cout << "processing " << infile << "\n";

	elf_parser::Elf_parser elf_parser(infile);
	if (elf_parser.failed()) {
		std::cerr << infile << ": readelf failed: " << elf_parser.last_error() << "\n";
		return false;
	}

	// Open ELF file for reading and writing
	int fd = open(infile.c_str(), O_RDWR);
	if (fd < 0) {
		std::cerr << infile << " open failed: " << strerror(errno) << "\n";
		return false;
	}

	// Find all .sshash.str sections
	unsigned int found = 0;
	std::vector<elf_parser::section_t> sections = elf_parser.get_sections();
	for (auto& s : sections) {
		if (s.section_name.find(".sshash.str") != std::string::npos) {
			if (!elf_process_section(map, sha, infile, fd, s))
				return false;
			found++;
		}
	}

	close(fd);

	if (!found)
		std::cout << "warn: " << infile << " : does not contain .sshash.str sections\n";

	return true;
}